

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O2

int gray_raster_new(QT_FT_Raster *araster)

{
  QT_FT_Raster pTVar1;
  
  pTVar1 = (QT_FT_Raster)calloc(1,0x30);
  *araster = pTVar1;
  return (uint)(pTVar1 != (QT_FT_Raster)0x0) * 4 + -4;
}

Assistant:

static int
  gray_raster_new( QT_FT_Raster*  araster )
  {
    *araster = malloc(sizeof(TRaster));
    if (!*araster) {
        *araster = 0;
        return ErrRaster_Memory_Overflow;
    }
    QT_FT_MEM_ZERO(*araster, sizeof(TRaster));

    return 0;
  }